

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

int Extra_ThreshSelectWeights8(word *t,int nVars,int *pW)

{
  int Cost;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int Cost_1;
  int iVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  
  if (nVars != 8) {
    __assert_fail("nVars == 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                  ,0x130,"int Extra_ThreshSelectWeights8(word *, int, int *)");
  }
  pW[7] = 1;
  iVar9 = 1;
  iVar11 = 0;
  do {
    iVar14 = 8;
    if (8 < iVar11) {
      iVar14 = iVar11;
    }
    pW[6] = iVar9;
    iVar1 = iVar9;
    do {
      pW[5] = iVar1;
      iVar2 = iVar1;
      do {
        pW[4] = iVar2;
        iVar3 = iVar2;
        do {
          pW[3] = iVar3;
          iVar4 = iVar3;
          do {
            pW[2] = iVar4;
            iVar5 = iVar4;
            do {
              pW[1] = iVar5;
              iVar6 = iVar5;
              do {
                *pW = iVar6;
                iVar7 = iVar6;
                do {
                  iVar8 = 10000;
                  uVar16 = 0;
                  iVar12 = 0;
                  while( true ) {
                    uVar15 = (uint)uVar16;
                    lVar13 = 0;
                    if ((t[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
                      iVar10 = 0;
                      do {
                        if ((uVar15 >> ((uint)lVar13 & 0x1f) & 1) != 0) {
                          iVar10 = iVar10 + pW[lVar13];
                        }
                        lVar13 = lVar13 + 1;
                      } while (lVar13 != 8);
                      if (iVar12 <= iVar10) {
                        iVar12 = iVar10;
                      }
                    }
                    else {
                      iVar10 = 0;
                      do {
                        if ((uVar15 >> ((uint)lVar13 & 0x1f) & 1) != 0) {
                          iVar10 = iVar10 + pW[lVar13];
                        }
                        lVar13 = lVar13 + 1;
                      } while (lVar13 != 8);
                      if (iVar10 <= iVar8) {
                        iVar8 = iVar10;
                      }
                    }
                    if (iVar8 <= iVar12) break;
                    uVar16 = (ulong)(uVar15 + 1);
                    if (uVar15 + 1 == 0x100) {
                      return iVar8;
                    }
                  }
                  *pW = iVar7 + 1;
                  bVar17 = iVar7 < 9;
                  iVar7 = iVar7 + 1;
                } while (bVar17);
                pW[1] = iVar6 + 1;
                bVar17 = iVar6 < 9;
                iVar6 = iVar6 + 1;
              } while (bVar17);
              pW[2] = iVar5 + 1;
              bVar17 = iVar5 < 9;
              iVar5 = iVar5 + 1;
            } while (bVar17);
            pW[3] = iVar4 + 1;
            bVar17 = iVar4 < 9;
            iVar4 = iVar4 + 1;
          } while (bVar17);
          pW[4] = iVar3 + 1;
          bVar17 = iVar3 < 9;
          iVar3 = iVar3 + 1;
        } while (bVar17);
        pW[5] = iVar2 + 1;
        bVar17 = iVar2 < 9;
        iVar2 = iVar2 + 1;
      } while (bVar17);
      pW[6] = iVar1 + 1;
      bVar17 = iVar1 != iVar14 + 1;
      iVar1 = iVar1 + 1;
    } while (bVar17);
    iVar9 = iVar9 + 1;
    pW[7] = iVar9;
    iVar11 = iVar11 + 1;
    if (iVar11 == 9) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights8(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 1; // <<-- incomplete detection to save runtime!
    assert(nVars == 8);
    for (pW[7] = 1; pW[7] <= Limit; pW[7]++)
        for (pW[6] = pW[7]; pW[6] <= Limit; pW[6]++)
            for (pW[5] = pW[6]; pW[5] <= Limit; pW[5]++)
                for (pW[4] = pW[5]; pW[4] <= Limit; pW[4]++)
                    for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
                        for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
                            for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
                                for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
                                    Lmin = 10000;
                                    Lmax = 0;
                                    for (m = 0; m < nMints; m++) {
                                        if (Abc_TtGetBit(t, m))
                                            Lmin = Abc_MinInt(Lmin,
                                                    Extra_ThreshWeightedSum(pW,
                                                            nVars, m));
                                        else
                                            Lmax = Abc_MaxInt(Lmax,
                                                    Extra_ThreshWeightedSum(pW,
                                                            nVars, m));
                                        if (Lmax >= Lmin)
                                            break;
                                    }
                                    if (m < nMints)
                                        continue;
                                    assert(Lmax < Lmin);
                                    return Lmin;
                                }
    return 0;
}